

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O1

bool __thiscall FRFFFile::Open(FRFFFile *this,bool quiet)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  FileReader *pFVar3;
  FRFFLump *pFVar4;
  void *pvVar5;
  ulong *puVar6;
  size_t sVar7;
  undefined4 uVar8;
  ulong uVar9;
  long lVar10;
  char *__src;
  char name [13];
  char local_65 [8];
  undefined1 local_5d;
  FRFFFile *local_58;
  void *local_50;
  FString local_48;
  undefined1 local_40 [8];
  uint local_38;
  uint local_34;
  
  pFVar3 = (this->super_FResourceFile).Reader;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,local_40,0x10);
  (this->super_FResourceFile).NumLumps = local_34;
  pvVar5 = operator_new__((ulong)local_34 * 0x30);
  pFVar3 = (this->super_FResourceFile).Reader;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,(ulong)local_38,0);
  pFVar3 = (this->super_FResourceFile).Reader;
  local_58 = this;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,pvVar5,(ulong)local_34 * 0x30);
  if (0 < (int)(local_34 * 0x30)) {
    uVar9 = 0;
    do {
      *(byte *)((long)pvVar5 + uVar9) =
           *(byte *)((long)pvVar5 + uVar9) ^ (char)(uVar9 >> 1) + (char)local_38;
      uVar9 = uVar9 + 1;
    } while (local_34 * 0x30 != uVar9);
  }
  uVar9 = (ulong)(local_58->super_FResourceFile).NumLumps;
  local_50 = pvVar5;
  puVar6 = (ulong *)operator_new__(uVar9 * 0x58 + 8);
  *puVar6 = uVar9;
  if (uVar9 != 0) {
    lVar10 = 0;
    do {
      *(undefined8 *)((long)puVar6 + lVar10 + 0x18) = 0x87e02c;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      *(undefined2 *)((long)puVar6 + lVar10 + 0x30) = 0;
      *(undefined1 *)((long)puVar6 + lVar10 + 0x20) = 0;
      puVar1 = (undefined8 *)((long)puVar6 + lVar10 + 0x38);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)puVar6 + lVar10 + 0x44);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined ***)
       ((long)&(((FRFFLump *)(puVar6 + 1))->super_FUncompressedLump).super_FResourceLump.
               _vptr_FResourceLump + lVar10) = &PTR__FResourceLump_008649f8;
      lVar10 = lVar10 + 0x58;
    } while (uVar9 * 0x58 - lVar10 != 0);
  }
  local_58->Lumps = (FRFFLump *)(puVar6 + 1);
  if ((!quiet) && (batchrun == false)) {
    Printf(", %d lumps\n",uVar9);
  }
  if ((local_58->super_FResourceFile).NumLumps != 0) {
    __src = (char *)((long)local_50 + 0x24);
    lVar10 = 0;
    uVar9 = 0;
    do {
      pFVar4 = local_58->Lumps;
      *(undefined4 *)(&(pFVar4->super_FUncompressedLump).super_FResourceLump.field_0x4c + lVar10) =
           *(undefined4 *)(__src + -0x14);
      *(undefined4 *)
       ((long)&(pFVar4->super_FUncompressedLump).super_FResourceLump.LumpSize + lVar10) =
           *(undefined4 *)(__src + -0x10);
      *(FRFFFile **)((long)&(pFVar4->super_FUncompressedLump).super_FResourceLump.Owner + lVar10) =
           local_58;
      if ((__src[-4] & 0x10U) != 0) {
        pBVar2 = &(pFVar4->super_FUncompressedLump).super_FResourceLump.Flags + lVar10;
        *pBVar2 = *pBVar2 | 8;
      }
      *(undefined4 *)((long)&pFVar4->IndexNum + lVar10) = *(undefined4 *)(__src + 8);
      strncpy(local_65,__src,8);
      local_5d = 0;
      sVar7 = strlen(local_65);
      if (0xc < sVar7 + 4) {
        __assert_fail("len + 4 <= 12",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/file_rff.cpp"
                      ,0xab,"virtual bool FRFFFile::Open(bool)");
      }
      local_65[sVar7] = '.';
      local_65[sVar7 + 1] = __src[-3];
      local_65[sVar7 + 2] = __src[-2];
      local_65[sVar7 + 3] = __src[-1];
      local_65[sVar7 + 4] = '\0';
      FString::FString(&local_48,local_65);
      FResourceLump::LumpNameSetup
                ((FResourceLump *)
                 ((long)&(pFVar4->super_FUncompressedLump).super_FResourceLump._vptr_FResourceLump +
                 lVar10),&local_48);
      FString::~FString(&local_48);
      if (local_65[sVar7 + 1] == 'R') {
        if ((local_65[sVar7 + 2] == 'A') && (uVar8 = 6, local_65[sVar7 + 3] == 'W'))
        goto LAB_0060ad00;
      }
      else if ((local_65[sVar7 + 1] == 'S') &&
              ((local_65[sVar7 + 2] == 'F' && (uVar8 = 7, local_65[sVar7 + 3] == 'X')))) {
LAB_0060ad00:
        *(undefined4 *)
         ((long)&(local_58->Lumps->super_FUncompressedLump).super_FResourceLump.Namespace + lVar10)
             = uVar8;
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x58;
      __src = __src + 0x30;
    } while (uVar9 < (local_58->super_FResourceFile).NumLumps);
  }
  operator_delete__(local_50);
  return true;
}

Assistant:

bool FRFFFile::Open(bool quiet)
{
	RFFLump *lumps;
	RFFInfo header;

	Reader->Read(&header, sizeof(header));

	NumLumps = LittleLong(header.NumLumps);
	header.DirOfs = LittleLong(header.DirOfs);
	lumps = new RFFLump[header.NumLumps];
	Reader->Seek (header.DirOfs, SEEK_SET);
	Reader->Read (lumps, header.NumLumps * sizeof(RFFLump));
	BloodCrypt (lumps, header.DirOfs, header.NumLumps * sizeof(RFFLump));

	Lumps = new FRFFLump[NumLumps];

	if (!quiet && !batchrun) Printf(", %d lumps\n", NumLumps);
	for (DWORD i = 0; i < NumLumps; ++i)
	{
		Lumps[i].Position = LittleLong(lumps[i].FilePos);
		Lumps[i].LumpSize = LittleLong(lumps[i].Size);
		Lumps[i].Owner = this;
		if (lumps[i].Flags & 0x10)
		{
			Lumps[i].Flags |= LUMPF_BLOODCRYPT;
		}
		Lumps[i].IndexNum = LittleLong(lumps[i].IndexNum);
		// Rearrange the name and extension to construct the fullname.
		char name[13];
		strncpy(name, lumps[i].Name, 8);
		name[8] = 0;
		size_t len = strlen(name);
		assert(len + 4 <= 12);
		name[len+0] = '.';
		name[len+1] = lumps[i].Extension[0];
		name[len+2] = lumps[i].Extension[1];
		name[len+3] = lumps[i].Extension[2];
		name[len+4] = 0;
		Lumps[i].LumpNameSetup(name);
		if (name[len+1] == 'S' && name[len+2] == 'F' && name[len+3] == 'X')
		{
			Lumps[i].Namespace = ns_bloodsfx;
		}
		else if (name[len+1] == 'R' && name[len+2] == 'A' && name[len+3] == 'W')
		{
			Lumps[i].Namespace = ns_bloodraw;
		}
	}
	delete[] lumps;
	return true;
}